

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::CheckLyLyc(GB *this)

{
  byte bVar1;
  byte bVar2;
  u8 now;
  u8 old;
  GB *this_local;
  
  bVar1 = (this->s).io[0x41];
  bVar2 = ((this->s).io[0x44] == (this->s).io[0x45]) << 2;
  (this->s).io[0x41] = (this->s).io[0x41] & 0xfb | bVar2;
  if (((bVar2 & (bVar1 & 4 ^ bVar2)) != 0) && (((this->s).io[0x41] & 0x40) != 0)) {
    (this->s).io[0xf] = (this->s).io[0xf] | 2;
  }
  return;
}

Assistant:

void GB::CheckLyLyc() {
  u8 old = s.io[STAT] & 4;
  u8 now = !!(s.io[LY] == s.io[LYC]) << 2;
  s.io[STAT] = (s.io[STAT] & ~4) | now;
  if ((now & (old ^ now)) && (s.io[STAT] & 0x40)) {
    s.io[IF] |= 2;
    DPRINT(INTERRUPTS, "trigger STAT IF 2 ly=lyc=%d\n", s.io[LY]);
  }
}